

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<char_*,_char>_>,_char,_fmt::v5::basic_format_context<char_*,_char>_>
::on_replacement_field
          (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<char_*,_char>_>,_char,_fmt::v5::basic_format_context<char_*,_char>_>
           *this,char *p)

{
  size_t *psVar1;
  char *pcVar2;
  type pcVar3;
  arg_formatter<fmt::v5::output_range<char_*,_char>_> local_28;
  
  pcVar2 = (this->context).
           super_context_base<char_*,_fmt::v5::basic_format_context<char_*,_char>,_char>.
           parse_context_.format_str_.data_;
  (this->context).super_context_base<char_*,_fmt::v5::basic_format_context<char_*,_char>,_char>.
  parse_context_.format_str_.data_ = p;
  psVar1 = &(this->context).
            super_context_base<char_*,_fmt::v5::basic_format_context<char_*,_char>,_char>.
            parse_context_.format_str_.size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)p));
  local_28.ctx_ = &this->context;
  if ((this->arg).type_ == custom_type) {
    (*(this->arg).value_.field_0.custom.format)((this->arg).value_.field_0.pointer,local_28.ctx_);
    return;
  }
  local_28.super_arg_formatter_base<fmt::v5::output_range<char_*,_char>_>.writer_.out_ =
       (this->context).super_context_base<char_*,_fmt::v5::basic_format_context<char_*,_char>,_char>
       .out_;
  local_28.super_arg_formatter_base<fmt::v5::output_range<char_*,_char>_>.writer_.locale_.locale_ =
       (this->context).super_context_base<char_*,_fmt::v5::basic_format_context<char_*,_char>,_char>
       .loc_.locale_;
  local_28.super_arg_formatter_base<fmt::v5::output_range<char_*,_char>_>.specs_ =
       (format_specs *)0x0;
  pcVar3 = visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<char*,char>>,fmt::v5::basic_format_context<char*,char>>
                     (&local_28,&this->arg);
  (this->context).super_context_base<char_*,_fmt::v5::basic_format_context<char_*,_char>,_char>.out_
       = pcVar3;
  return;
}

Assistant:

void on_replacement_field(const Char *p) {
    context.parse_context().advance_to(p);
    internal::custom_formatter<Char, Context> f(context);
    if (!visit_format_arg(f, arg))
      context.advance_to(visit_format_arg(ArgFormatter(context), arg));
  }